

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O1

char * stbi__hdr_gettoken(stbi__context *z,char *buffer)

{
  int iVar1;
  stbi_uc *psVar2;
  stbi_uc *psVar3;
  stbi_uc sVar4;
  long lVar5;
  bool bVar6;
  
  psVar2 = z->img_buffer;
  if (z->img_buffer_end <= psVar2) {
    if (z->read_from_callbacks == 0) {
      sVar4 = '\0';
      goto LAB_00120ac0;
    }
    psVar2 = z->buffer_start;
    iVar1 = (*(z->io).read)(z->io_user_data,(char *)psVar2,z->buflen);
    if (iVar1 == 0) {
      z->read_from_callbacks = 0;
      z->img_buffer = psVar2;
      z->img_buffer_end = z->buffer_start + 1;
      z->buffer_start[0] = '\0';
    }
    else {
      z->img_buffer = psVar2;
      z->img_buffer_end = psVar2 + iVar1;
    }
    psVar2 = z->img_buffer;
  }
  z->img_buffer = psVar2 + 1;
  sVar4 = *psVar2;
LAB_00120ac0:
  psVar2 = z->buffer_start;
  lVar5 = 0;
  do {
    if ((z->io).read == (_func_int_void_ptr_char_ptr_int *)0x0) {
LAB_00120ae5:
      bVar6 = z->img_buffer < z->img_buffer_end;
    }
    else {
      iVar1 = (*(z->io).eof)(z->io_user_data);
      if (iVar1 == 0) {
        bVar6 = true;
      }
      else {
        if (z->read_from_callbacks != 0) goto LAB_00120ae5;
        bVar6 = false;
      }
    }
    if ((sVar4 == '\n') || (!bVar6)) goto LAB_00120c41;
    buffer[lVar5] = sVar4;
    if (lVar5 == 0x3fe) break;
    psVar3 = z->img_buffer;
    if (psVar3 < z->img_buffer_end) {
LAB_00120b82:
      z->img_buffer = psVar3 + 1;
      sVar4 = *psVar3;
    }
    else {
      if (z->read_from_callbacks != 0) {
        iVar1 = (*(z->io).read)(z->io_user_data,(char *)psVar2,z->buflen);
        if (iVar1 == 0) {
          z->read_from_callbacks = 0;
          z->img_buffer = psVar2;
          z->img_buffer_end = z->buffer_start + 1;
          z->buffer_start[0] = '\0';
        }
        else {
          z->img_buffer = psVar2;
          z->img_buffer_end = psVar2 + iVar1;
        }
        psVar3 = z->img_buffer;
        goto LAB_00120b82;
      }
      sVar4 = '\0';
    }
    lVar5 = lVar5 + 1;
  } while( true );
LAB_00120b98:
  if ((z->io).read == (_func_int_void_ptr_char_ptr_int *)0x0) {
LAB_00120bb6:
    if (z->img_buffer_end <= z->img_buffer) goto LAB_00120c3b;
  }
  else {
    iVar1 = (*(z->io).eof)(z->io_user_data);
    if (iVar1 != 0) {
      if (z->read_from_callbacks != 0) goto LAB_00120bb6;
      goto LAB_00120c3b;
    }
  }
  psVar3 = z->img_buffer;
  if (z->img_buffer_end <= psVar3) {
    if (z->read_from_callbacks == 0) goto LAB_00120b98;
    iVar1 = (*(z->io).read)(z->io_user_data,(char *)psVar2,z->buflen);
    if (iVar1 == 0) {
      z->read_from_callbacks = 0;
      z->img_buffer = psVar2;
      z->img_buffer_end = z->buffer_start + 1;
      z->buffer_start[0] = '\0';
    }
    else {
      z->img_buffer = psVar2;
      z->img_buffer_end = psVar2 + iVar1;
    }
    psVar3 = z->img_buffer;
  }
  z->img_buffer = psVar3 + 1;
  if (*psVar3 == '\n') {
LAB_00120c3b:
    lVar5 = 0x3ff;
LAB_00120c41:
    buffer[lVar5] = '\0';
    return buffer;
  }
  goto LAB_00120b98;
}

Assistant:

static char *stbi__hdr_gettoken(stbi__context *z, char *buffer)
{
   int len=0;
   char c = '\0';

   c = (char) stbi__get8(z);

   while (!stbi__at_eof(z) && c != '\n') {
      buffer[len++] = c;
      if (len == STBI__HDR_BUFLEN-1) {
         // flush to end of line
         while (!stbi__at_eof(z) && stbi__get8(z) != '\n')
            ;
         break;
      }
      c = (char) stbi__get8(z);
   }

   buffer[len] = 0;
   return buffer;
}